

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O1

void __thiscall
slang::
SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
::cleanup(SmallVectorBase<std::variant<slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>_>
          *this,EVP_PKEY_CTX *ctx)

{
  _Variant_storage<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
  *this_00;
  long lVar1;
  
  if (this->len != 0) {
    this_00 = (_Variant_storage<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
               *)this->data_;
    lVar1 = this->len * 0x58;
    do {
      std::__detail::__variant::
      _Variant_storage<false,_slang::ast::LValue::BitSlice,_slang::ast::LValue::ElementIndex,_slang::ast::LValue::ArraySlice,_slang::ast::LValue::ArrayLookup>
      ::~_Variant_storage(this_00);
      this_00 = this_00 + 1;
      lVar1 = lVar1 + -0x58;
    } while (lVar1 != 0);
  }
  if (this->data_ != (pointer)this->firstElement) {
    operator_delete(this->data_);
    return;
  }
  return;
}

Assistant:

void cleanup() {
        std::ranges::destroy(*this);
        if (!isSmall())
            ::operator delete(data_);
    }